

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::CopyFaceIndicesLWO2
          (LWOImporter *this,iterator *it,uint16_t **cursor,uint16_t *end)

{
  uint uVar1;
  ushort *puVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  size_type sVar7;
  Logger *this_00;
  DeadlyImportError *this_01;
  allocator<char> local_61;
  string local_60;
  uint local_40;
  ushort local_3a;
  uint i;
  uint16_t numIndices;
  reference local_30;
  Face *face;
  uint16_t *end_local;
  uint16_t **cursor_local;
  iterator *it_local;
  LWOImporter *this_local;
  
  face = (Face *)end;
  end_local = (uint16_t *)cursor;
  cursor_local = (uint16_t **)it;
  it_local = (iterator *)this;
  while( true ) {
    if (face <= *(Face **)end_local) {
      return;
    }
    _i = __gnu_cxx::
         __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
         ::operator++((__normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
                       *)cursor_local,0);
    local_30 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
               ::operator*((__normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
                            *)&i);
    puVar2 = *(ushort **)end_local;
    *(ushort **)end_local = puVar2 + 1;
    local_3a = *puVar2;
    ByteSwap::Swap2(&local_3a);
    (local_30->super_aiFace).mNumIndices = local_3a & 0x3ff;
    if ((local_30->super_aiFace).mNumIndices == 0) break;
    auVar3 = ZEXT416((local_30->super_aiFace).mNumIndices) * ZEXT816(4);
    uVar5 = auVar3._0_8_;
    if (auVar3._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    puVar6 = (uint *)operator_new__(uVar5);
    (local_30->super_aiFace).mIndices = puVar6;
    for (local_40 = 0; local_40 < (local_30->super_aiFace).mNumIndices; local_40 = local_40 + 1) {
      iVar4 = ReadVSizedIntLWO2(this,(uint8_t **)end_local);
      (local_30->super_aiFace).mIndices[local_40] = iVar4 + this->mCurLayer->mPointIDXOfs;
      uVar1 = (local_30->super_aiFace).mIndices[local_40];
      sVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        (&this->mCurLayer->mTempPoints);
      if (sVar7 < uVar1) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"LWO2: Failure evaluating face record, index is out of range");
        sVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&this->mCurLayer->mTempPoints);
        (local_30->super_aiFace).mIndices[local_40] = (int)sVar7 - 1;
      }
    }
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"LWO2: Encountered invalid face record with zero indices",&local_61
            );
  DeadlyImportError::DeadlyImportError(this_01,&local_60);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::CopyFaceIndicesLWO2(FaceList::iterator& it,
    uint16_t*& cursor,
    const uint16_t* const end)
{
    while (cursor < end)
    {
        LWO::Face& face = *it++;
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        AI_LSWAP2(numIndices);
        face.mNumIndices = numIndices & 0x03FF;

        if(face.mNumIndices) /* byte swapping has already been done */
        {
            face.mIndices = new unsigned int[face.mNumIndices];
            for(unsigned int i = 0; i < face.mNumIndices; i++)
            {
                face.mIndices[i] = ReadVSizedIntLWO2((uint8_t*&)cursor) + mCurLayer->mPointIDXOfs;
                if(face.mIndices[i] > mCurLayer->mTempPoints.size())
                {
                    ASSIMP_LOG_WARN("LWO2: Failure evaluating face record, index is out of range");
                    face.mIndices[i] = (unsigned int)mCurLayer->mTempPoints.size()-1;
                }
            }
        }
        else throw DeadlyImportError("LWO2: Encountered invalid face record with zero indices");
    }
}